

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void embree::SceneGraph::store
               (Ref<embree::SceneGraph::Node> *root,FileName *filename,bool embedTextures,
               bool referenceMaterials,bool binaryFormat)

{
  long *plVar1;
  long lVar2;
  byte bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  byte in_CL;
  byte in_DL;
  long *in_RDI;
  byte in_R8B;
  undefined1 in_stack_00000385;
  undefined1 in_stack_00000386;
  undefined1 in_stack_00000387;
  FileName *in_stack_00000388;
  Ref<embree::SceneGraph::Node> *in_stack_00000390;
  char *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  FileName *this;
  string *in_stack_ffffffffffffff08;
  string local_d8 [32];
  long *local_b8;
  allocator local_a9;
  string local_a8 [48];
  FileName local_78;
  string local_58 [37];
  byte local_33;
  byte local_32;
  byte local_31;
  long **local_18;
  long **local_10;
  
  local_31 = in_DL & 1;
  local_32 = in_CL & 1;
  local_33 = in_R8B & 1;
  this = &local_78;
  embree::FileName::ext_abi_cxx11_(this);
  toLowerCase(in_stack_ffffffffffffff08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"xml",&local_a9);
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                          in_stack_fffffffffffffed8);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)&local_78);
  if ((bVar3 & 1) == 0) {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x10);
    embree::FileName::ext_abi_cxx11_(this);
    std::operator+(in_stack_fffffffffffffec8,__rhs);
    std::runtime_error::runtime_error((runtime_error *)__rhs,local_d8);
    __cxa_throw(__rhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_18 = &local_b8;
  plVar1 = (long *)*in_RDI;
  if (plVar1 != (long *)0x0) {
    lVar2 = *local_b8;
    local_b8 = plVar1;
    (**(code **)(lVar2 + 0x10))();
    plVar1 = local_b8;
  }
  local_b8 = plVar1;
  storeXML(in_stack_00000390,in_stack_00000388,(bool)in_stack_00000387,(bool)in_stack_00000386,
           (bool)in_stack_00000385);
  local_10 = &local_b8;
  if (local_b8 != (long *)0x0) {
    (**(code **)(*local_b8 + 0x18))();
  }
  return;
}

Assistant:

void SceneGraph::store(Ref<SceneGraph::Node> root, const FileName& filename, bool embedTextures, bool referenceMaterials, bool binaryFormat)
  {
    if (toLowerCase(filename.ext()) == std::string("xml")) {
      storeXML(root,filename,embedTextures,referenceMaterials,binaryFormat);
    }
    else
      throw std::runtime_error("unknown scene format: " + filename.ext());
  }